

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O0

void Curl_strntolower(char *dest,char *src,size_t n)

{
  char cVar1;
  bool bVar2;
  size_t local_20;
  size_t n_local;
  char *src_local;
  char *dest_local;
  
  local_20 = n;
  n_local = (size_t)src;
  src_local = dest;
  if (n != 0) {
    do {
      cVar1 = Curl_raw_tolower(*(char *)n_local);
      *src_local = cVar1;
      bVar2 = false;
      if (*(char *)n_local != '\0') {
        local_20 = local_20 - 1;
        bVar2 = local_20 != 0;
      }
      n_local = n_local + 1;
      src_local = src_local + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Curl_strntolower(char *dest, const char *src, size_t n)
{
  if(n < 1)
    return;

  do {
    *dest++ = Curl_raw_tolower(*src);
  } while(*src++ && --n);
}